

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O0

double chi_square_pdf(double x,double a)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined8 local_28;
  double pdf;
  double b;
  double a_local;
  double x_local;
  
  if (0.0 <= x) {
    dVar1 = a / 2.0;
    dVar2 = exp(x * -0.5);
    dVar3 = pow(x,dVar1 - 1.0);
    dVar4 = pow(2.0,dVar1);
    dVar1 = tgamma(dVar1);
    local_28 = (dVar2 * dVar3) / (dVar4 * dVar1);
  }
  else {
    local_28 = 0.0;
  }
  return local_28;
}

Assistant:

double chi_square_pdf ( double x, double a )

//****************************************************************************80
//
//  Purpose:
//
//    CHI_SQUARE_PDF evaluates the central Chi squared PDF.
//
//  Discussion:
//
//    PDF(A;X) =
//      EXP ( - X / 2 ) * X^((A-2)/2) / ( 2^(A/2) * GAMMA ( A/2 ) )
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    12 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double X, the argument of the PDF.
//    0.0 <= X
//
//    Input, double A, the parameter of the PDF.
//    1 <= A.
//
//    Output, double PDF, the value of the PDF.
//
{
  double b;
  double pdf;

  if ( x < 0.0 )
  {
    pdf = 0.0;
  }
  else
  {
    b = a / 2.0;
    pdf = exp ( -0.5 * x ) * pow ( x, ( b - 1.0 ) ) / ( pow ( 2.0, b )
    * tgamma ( b ) );
  }

  return pdf;
}